

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double basym(double *a,double *b,double *lambda,double *eps)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  ulong local_98;
  int local_58;
  
  basym::basym = 0.0;
  dVar17 = *a;
  dVar1 = *b;
  if (dVar17 < dVar1) {
    basym::h = dVar17 / dVar1;
  }
  else {
    basym::h = dVar1 / dVar17;
  }
  dVar14 = dVar17;
  if (dVar17 >= dVar1) {
    dVar14 = dVar1;
  }
  basym::r0 = 1.0 / (basym::h + 1.0);
  basym::r1 = (dVar1 - dVar17) /
              (double)(~-(ulong)(dVar17 < dVar1) & (ulong)dVar17 |
                      -(ulong)(dVar17 < dVar1) & (ulong)dVar1);
  dVar14 = (basym::h + 1.0) * dVar14;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  basym::w0 = 1.0 / dVar14;
  basym::T1 = -*lambda / *a;
  basym::T2 = *lambda / *b;
  dVar17 = *a;
  dVar14 = rlog1(&basym::T1);
  dVar1 = *b;
  dVar15 = rlog1(&basym::T2);
  basym::f = dVar15 * dVar1 + dVar14 * dVar17;
  basym::t = exp(-basym::f);
  if ((basym::t != 0.0) || (NAN(basym::t))) {
    if (basym::f < 0.0) {
      basym::z0 = sqrt(basym::f);
    }
    else {
      basym::z0 = SQRT(basym::f);
    }
    basym::z = (basym::z0 / 0.353553390593274) * 0.5;
    basym::z2 = basym::f + basym::f;
    basym::a0[0] = basym::r1 * 0.6666666666666666;
    basym::d[0] = basym::a0[0] * 0.5;
    basym::c[0] = -basym::d[0];
    dVar16 = erfc1(&basym::K3,&basym::z0);
    dVar15 = basym::z2;
    dVar14 = basym::w0;
    dVar1 = basym::h;
    dVar16 = dVar16 * 0.4431134627263801;
    basym::sum = basym::d[0] * basym::w0 * 0.353553390593274 + dVar16;
    dVar18 = basym::h * basym::h;
    dVar21 = basym::r0 + basym::r0;
    dVar22 = basym::r1 + basym::r1;
    dVar17 = 0.353553390593274;
    local_98 = 4;
    pdVar9 = basym::d;
    dVar28 = 1.0;
    dVar29 = 1.0;
    uVar11 = 2;
    dVar24 = basym::w0;
    dVar31 = basym::z;
    dVar32 = basym::z2;
    do {
      if (0x14 < uVar11) break;
      dVar29 = dVar29 * dVar18;
      iVar2 = (int)uVar11;
      local_58 = iVar2 + -1;
      dVar28 = dVar28 + dVar29;
      auVar20._0_8_ = (dVar1 * dVar29 + 1.0) * dVar21;
      auVar20._8_8_ = dVar28 * dVar22;
      auVar26._0_8_ = uVar11 + 2 & 0xffffffff;
      auVar26._8_4_ = iVar2 + 3;
      auVar26._12_4_ = 0;
      auVar27._0_8_ = SUB168(auVar26 | _DAT_00112cb0,0) - (double)DAT_00112cb0;
      auVar27._8_8_ = SUB168(auVar26 | _DAT_00112cb0,8) - DAT_00112cb0._8_8_;
      auVar20 = divpd(auVar20,auVar27);
      *(undefined1 (*) [16])(&basym::z2 + uVar11) = auVar20;
      dVar30 = basym::a0[0];
      pdVar10 = pdVar9;
      uVar12 = uVar11;
      while (uVar12 != local_98) {
        dVar23 = (double)(uVar12 + 1 & 0xffffffff);
        dVar25 = dVar23 * -0.5;
        basym::b0[0] = dVar25 * dVar30;
        pdVar6 = basym::b0;
        uVar7 = 1;
        for (uVar3 = 2; uVar3 <= uVar12; uVar3 = uVar3 + 1) {
          dVar19 = 0.0;
          pdVar4 = basym::a0;
          iVar8 = 1;
          pdVar5 = pdVar6;
          uVar13 = uVar7;
          while (uVar13 != 0) {
            dVar19 = dVar19 + ((double)iVar8 * dVar25 - (double)(int)uVar13) * *pdVar4 * *pdVar5;
            iVar8 = iVar8 + 1;
            pdVar4 = pdVar4 + 1;
            pdVar5 = pdVar5 + -1;
            uVar13 = uVar13 - 1;
          }
          (&DAT_001165f8)[uVar3] = (&basym::z2)[uVar3] * dVar25 + dVar19 / (double)(int)uVar3;
          uVar7 = uVar7 + 1;
          pdVar6 = pdVar6 + 1;
        }
        dVar23 = (double)(&DAT_001165f8)[uVar12] / dVar23;
        pdVar5 = basym::c;
        *(double *)(uVar12 * 8 + 0x1166a8) = dVar23;
        basym::dsum = 0.0;
        pdVar6 = pdVar10;
        for (uVar3 = 1; uVar3 < uVar12; uVar3 = uVar3 + 1) {
          basym::dsum = basym::dsum + *pdVar6 * *pdVar5;
          pdVar5 = pdVar5 + 1;
          pdVar6 = pdVar6 + -1;
        }
        (&DAT_00116758)[uVar12] = -(dVar23 + basym::dsum);
        pdVar10 = pdVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      dVar16 = dVar16 * (double)local_58 + dVar31 * 0.353553390593274;
      dVar17 = dVar17 * (double)iVar2 + dVar32 * 0.353553390593274;
      dVar30 = dVar24 * dVar14;
      dVar24 = dVar14 * dVar30;
      dVar30 = dVar30 * (double)(&DAT_00116758)[uVar11] * dVar16;
      dVar23 = dVar24 * basym::d[uVar11] * dVar17;
      basym::sum = basym::sum + dVar23 + dVar30;
      local_98 = local_98 + 2;
      pdVar9 = pdVar9 + 2;
      uVar11 = uVar11 + 2;
      dVar31 = dVar15 * dVar31;
      dVar32 = dVar15 * dVar32;
    } while (*eps * basym::sum < ABS(dVar23) + ABS(dVar30));
    dVar17 = bcorr(a,b);
    dVar17 = exp(-dVar17);
    basym::basym = basym::t * 1.12837916709551 * dVar17 * basym::sum;
  }
  return basym::basym;
}

Assistant:

double basym(double *a,double *b,double *lambda,double *eps)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) FOR LARGE A AND B.
     LAMBDA = (A + B)*Y - B  AND EPS IS THE TOLERANCE USED.
     IT IS ASSUMED THAT LAMBDA IS NONNEGATIVE AND THAT
     A AND B ARE GREATER THAN OR EQUAL TO 15.
-----------------------------------------------------------------------
*/
{
static double e0 = 1.12837916709551e0;
static double e1 = .353553390593274e0;
static int num = 20;
/*
------------------------
     ****** NUM IS THE MAXIMUM VALUE THAT N CAN TAKE IN THE DO LOOP
            ENDING AT STATEMENT 50. IT IS REQUIRED THAT NUM BE EVEN.
            THE ARRAYS A0, B0, C, D HAVE DIMENSION NUM + 1.
------------------------
     E0 = 2/SQRT(PI)
     E1 = 2**(-3/2)
------------------------
*/
static int K3 = 1;
static double basym,bsum,dsum,f,h,h2,hn,j0,j1,r,r0,r1,s,sum,t,t0,t1,u,w,w0,z,z0,
    z2,zn,znm1;
static int i,im1,imj,j,m,mm1,mmj,n,np1;
static double a0[21],b0[21],c[21],d[21],T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    basym = 0.0e0;
    if(*a >= *b) goto S10;
    h = *a/ *b;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *b;
    w0 = 1.0e0/sqrt(*a*(1.0e0+h));
    goto S20;
S10:
    h = *b/ *a;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *a;
    w0 = 1.0e0/sqrt(*b*(1.0e0+h));
S20:
    T1 = -(*lambda/ *a);
    T2 = *lambda/ *b;
    f = *a*rlog1(&T1)+*b*rlog1(&T2);
    t = exp(-f);
    if(t == 0.0e0) return basym;
    z0 = sqrt(f);
    z = 0.5e0*(z0/e1);
    z2 = f+f;
    a0[0] = 2.0e0/3.0e0*r1;
    c[0] = -(0.5e0*a0[0]);
    d[0] = -c[0];
    j0 = 0.5e0/e0*erfc1(&K3,&z0);
    j1 = e1;
    sum = j0+d[0]*w0*j1;
    s = 1.0e0;
    h2 = h*h;
    hn = 1.0e0;
    w = w0;
    znm1 = z;
    zn = z2;
    for(n=2; n<=num; n+=2) {
        hn = h2*hn;
        a0[n-1] = 2.0e0*r0*(1.0e0+h*hn)/((double)n+2.0e0);
        np1 = n+1;
        s += hn;
        a0[np1-1] = 2.0e0*r1*s/((double)n+3.0e0);
        for(i=n; i<=np1; i++) {
            r = -(0.5e0*((double)i+1.0e0));
            b0[0] = r*a0[0];
            for(m=2; m<=i; m++) {
                bsum = 0.0e0;
                mm1 = m-1;
                for(j=1; j<=mm1; j++) {
                    mmj = m-j;
                    bsum += (((double)j*r-(double)mmj)*a0[j-1]*b0[mmj-1]);
                }
                b0[m-1] = r*a0[m-1]+bsum/(double)m;
            }
            c[i-1] = b0[i-1]/((double)i+1.0e0);
            dsum = 0.0e0;
            im1 = i-1;
            for(j=1; j<=im1; j++) {
                imj = i-j;
                dsum += (d[imj-1]*c[j-1]);
            }
            d[i-1] = -(dsum+c[i-1]);
        }
        j0 = e1*znm1+((double)n-1.0e0)*j0;
        j1 = e1*zn+(double)n*j1;
        znm1 = z2*znm1;
        zn = z2*zn;
        w = w0*w;
        t0 = d[n-1]*w*j0;
        w = w0*w;
        t1 = d[np1-1]*w*j1;
        sum += (t0+t1);
        if(fabs(t0)+fabs(t1) <= *eps*sum) goto S80;
    }
S80:
    u = exp(-bcorr(a,b));
    basym = e0*t*u*sum;
    return basym;
}